

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O0

void ym2610_write_pcmromb(void *chip,UINT32 offset,UINT32 length,UINT8 *data)

{
  YM2610 *F2610;
  UINT8 *data_local;
  UINT32 length_local;
  UINT32 offset_local;
  void *chip_local;
  
  if (offset <= *(uint *)((long)chip + 0x5390)) {
    data_local._0_4_ = length;
    if (*(uint *)((long)chip + 0x5390) < offset + length) {
      data_local._0_4_ = *(int *)((long)chip + 0x5390) - offset;
    }
    memcpy((void *)(*(long *)((long)chip + 0x5370) + (ulong)offset),data,(ulong)(UINT32)data_local);
  }
  return;
}

Assistant:

void ym2610_write_pcmromb(void* chip, UINT32 offset, UINT32 length, const UINT8* data)
{
	YM2610 *F2610 = (YM2610 *)chip;
	
	if (offset > F2610->deltaT.memory_size)
		return;
	if (offset + length > F2610->deltaT.memory_size)
		length = F2610->deltaT.memory_size - offset;
	
	memcpy(F2610->deltaT.memory + offset, data, length);
	
	return;
}